

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

bool loguru::add_file(char *path_in,FileMode mode,Verbosity verbosity)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  Verbosity VVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_t sVar7;
  double __x;
  double __x_00;
  double __x_01;
  char *local_10a8;
  char local_1098 [8];
  char preamble_explain [92];
  FILE *file;
  char *mode_str;
  char path [4096];
  Verbosity verbosity_local;
  FileMode mode_local;
  char *path_in_local;
  
  if (*path_in == '~') {
    pcVar4 = home_dir();
    snprintf((char *)&mode_str,0xfff,"%s%s",pcVar4,path_in + 1);
  }
  else {
    snprintf((char *)&mode_str,0xfff,"%s",path_in);
  }
  bVar2 = create_directories((char *)&mode_str);
  if ((!bVar2) && (VVar3 = current_verbosity_cutoff(), -3 < VVar3)) {
    log(__x);
  }
  if (mode == Truncate) {
    local_10a8 = "w";
  }
  else {
    local_10a8 = "a";
  }
  register0x00000000 = fopen((char *)&mode_str,local_10a8);
  if (register0x00000000 == (FILE *)0x0) {
    VVar3 = current_verbosity_cutoff();
    if (-3 < VVar3) {
      log(__x_00);
    }
    path_in_local._7_1_ = false;
  }
  else {
    add_callback(path_in,file_log,register0x00000000,verbosity,file_close,file_flush);
    if (mode == Append) {
      fprintf(stack0xffffffffffffefc8,"\n\n\n\n\n");
    }
    uVar5 = std::__cxx11::string::empty();
    __stream = stack0xffffffffffffefc8;
    if ((uVar5 & 1) == 0) {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"arguments: %s\n",uVar6);
    }
    sVar7 = strlen(s_current_dir);
    if (sVar7 != 0) {
      fprintf(stack0xffffffffffffefc8,"Current dir: %s\n",s_current_dir);
    }
    fprintf(stack0xffffffffffffefc8,"File verbosity level: %d\n",(ulong)(uint)verbosity);
    if ((g_preamble & 1) != 0) {
      print_preamble_header(local_1098,0x5c);
      fprintf(stack0xffffffffffffefc8,"%s\n",local_1098);
    }
    fflush(stack0xffffffffffffefc8);
    iVar1 = g_internal_verbosity;
    VVar3 = current_verbosity_cutoff();
    if (iVar1 <= VVar3) {
      log(__x_01);
    }
    path_in_local._7_1_ = true;
  }
  return path_in_local._7_1_;
}

Assistant:

bool add_file(const char* path_in, FileMode mode, Verbosity verbosity)
	{
		char path[PATH_MAX];
		if (path_in[0] == '~') {
			snprintf(path, sizeof(path) - 1, "%s%s", home_dir(), path_in + 1);
		} else {
			snprintf(path, sizeof(path) - 1, "%s", path_in);
		}

		if (!create_directories(path)) {
			LOG_F(ERROR, "Failed to create directories to '%s'", path);
		}

		const char* mode_str = (mode == FileMode::Truncate ? "w" : "a");
		auto file = fopen(path, mode_str);
		if (!file) {
			LOG_F(ERROR, "Failed to open '%s'", path);
			return false;
		}
#if LOGURU_WITH_FILEABS
		FileAbs* file_abs = new FileAbs(); // this is deleted in file_close;
		snprintf(file_abs->path, sizeof(file_abs->path) - 1, "%s", path);
		snprintf(file_abs->mode_str, sizeof(file_abs->mode_str) - 1, "%s", mode_str);
		stat(file_abs->path, &file_abs->st);
		file_abs->fp = file;
		file_abs->verbosity = verbosity;
		add_callback(path_in, file_log, file_abs, verbosity, file_close, file_flush);
#else
		add_callback(path_in, file_log, file, verbosity, file_close, file_flush);
#endif

		if (mode == FileMode::Append) {
			fprintf(file, "\n\n\n\n\n");
		}
		if (!s_arguments.empty()) {
			fprintf(file, "arguments: %s\n", s_arguments.c_str());
		}
		if (strlen(s_current_dir) != 0) {
			fprintf(file, "Current dir: %s\n", s_current_dir);
		}
		fprintf(file, "File verbosity level: %d\n", verbosity);
		if (g_preamble) {
			char preamble_explain[LOGURU_PREAMBLE_WIDTH];
			print_preamble_header(preamble_explain, sizeof(preamble_explain));
			fprintf(file, "%s\n", preamble_explain);
		}
		fflush(file);

		VLOG_F(g_internal_verbosity, "Logging to '%s', mode: '%s', verbosity: %d", path, mode_str, verbosity);
		return true;
	}